

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

char * linear_strdup(void *parent,char *str)

{
  size_t sVar1;
  char *ptr;
  uint n;
  char *str_local;
  void *parent_local;
  
  if (str == (char *)0x0) {
    parent_local = (void *)0x0;
  }
  else {
    sVar1 = strlen(str);
    parent_local = linear_alloc_child(parent,(int)sVar1 + 1);
    if (parent_local == (void *)0x0) {
      parent_local = (void *)0x0;
    }
    else {
      memcpy(parent_local,str,sVar1 & 0xffffffff);
      *(undefined1 *)((long)parent_local + (sVar1 & 0xffffffff)) = 0;
    }
  }
  return (char *)parent_local;
}

Assistant:

char *
linear_strdup(void *parent, const char *str)
{
   unsigned n;
   char *ptr;

   if (unlikely(!str))
      return NULL;

   n = strlen(str);
   ptr = linear_alloc_child(parent, n + 1);
   if (unlikely(!ptr))
      return NULL;

   memcpy(ptr, str, n);
   ptr[n] = '\0';
   return ptr;
}